

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap.cpp
# Opt level: O2

void Assimp::Bitmap::Save(aiTexture *texture,IOStream *file)

{
  Header header;
  Header local_50;
  DIB local_40;
  
  if (file != (IOStream *)0x0) {
    local_40.size = 0x28;
    local_40.width = texture->mWidth;
    local_40.height = texture->mHeight;
    local_40.planes = 1;
    local_40.bits_per_pixel = 0x20;
    local_40.compression = 0;
    local_40.image_size = (local_40.width & 0x3fffU) * 4 * local_40.height;
    local_40.x_resolution = 0;
    local_40.y_resolution = 0;
    local_40.nb_colors = 0;
    local_40.nb_important_colors = 0;
    local_50.type = 0x4d42;
    local_50.size = local_40.image_size + 0x36;
    local_50.reserved1 = 0;
    local_50.reserved2 = 0;
    local_50.offset = 0x36;
    WriteHeader(&local_50,file);
    WriteDIB(&local_40,file);
    WriteData(texture,file);
  }
  return;
}

Assistant:

void Bitmap::Save(aiTexture* texture, IOStream* file) {
        if(file != NULL) {
            Header header;
            DIB dib;

            dib.size = DIB::dib_size;
            dib.width = texture->mWidth;
            dib.height = texture->mHeight;
            dib.planes = 1;
            dib.bits_per_pixel = 8 * mBytesPerPixel;
            dib.compression = 0;
            dib.image_size = (((dib.width * mBytesPerPixel) + 3) & 0x0000FFFC) * dib.height;
            dib.x_resolution = 0;
            dib.y_resolution = 0;
            dib.nb_colors = 0;
            dib.nb_important_colors = 0;

            header.type = 0x4D42; // 'BM'
            header.offset = Header::header_size + DIB::dib_size;
            header.size = header.offset + dib.image_size;
            header.reserved1 = 0;
            header.reserved2 = 0;

            WriteHeader(header, file);
            WriteDIB(dib, file);
            WriteData(texture, file);
        }
    }